

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

void __thiscall Lowerer::LowerInitForInEnumerator(Lowerer *this,Instr *instr)

{
  uint profileId;
  Func *func;
  Func *func_00;
  code *pcVar1;
  bool bVar2;
  ExecutionMode EVar3;
  byte bVar4;
  JITTimeFunctionBody *this_00;
  undefined4 *puVar5;
  Opnd *forInEnumeratorOpnd;
  RegOpnd *this_01;
  AddrOpnd *opndArg;
  EnumeratorCache *local_38;
  
  func = instr->m_func;
  if (instr->m_kind == InstrKindProfiled) {
    profileId = *(uint *)&instr[1]._vptr_Instr;
    this_00 = JITTimeWorkItem::GetJITFunctionBody(instr->m_func->m_workItem);
    local_38 = JITTimeFunctionBody::GetForInCache(this_00,profileId);
    if (local_38 == (EnumeratorCache *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x7114,"(forInCache != nullptr)","forInCache != nullptr");
      if (!bVar2) goto LAB_005b13e9;
      *puVar5 = 0;
    }
    EVar3 = JITTimeWorkItem::GetJitMode(func->m_workItem);
    if ((EVar3 != SimpleJit) &&
       (func->m_scriptContextInfo[0x77]._vptr_ScriptContextInfo[0x2d7] == (_func_int *)0x0)) {
      GenerateInitForInEnumeratorFastPath(this,instr,local_38);
    }
  }
  else {
    local_38 = (EnumeratorCache *)0x0;
  }
  forInEnumeratorOpnd = IR::Instr::UnlinkSrc2(instr);
  this_01 = GenerateForInEnumeratorLoad(this,forInEnumeratorOpnd,instr);
  if (instr->m_src2 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x18b,"(this->m_src2 == __null)","Trying to overwrite existing src.");
    if (!bVar2) goto LAB_005b13e9;
    *puVar5 = 0;
  }
  func_00 = instr->m_func;
  if ((this_01->super_Opnd).isDeleted == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x14,"(!isDeleted)","Using deleted operand");
    if (!bVar2) {
LAB_005b13e9:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  bVar4 = (this_01->super_Opnd).field_0xb;
  if ((bVar4 & 2) != 0) {
    this_01 = (RegOpnd *)IR::Opnd::Copy(&this_01->super_Opnd,func_00);
    bVar4 = (this_01->super_Opnd).field_0xb;
  }
  (this_01->super_Opnd).field_0xb = bVar4 | 2;
  instr->m_src2 = &this_01->super_Opnd;
  opndArg = IR::AddrOpnd::New(local_38,AddrOpndKindForInCache,func,false,(Var)0x0);
  LowererMD::LoadHelperArgument(&this->m_lowererMD,instr,&opndArg->super_Opnd);
  LowerBinaryHelperMem(this,instr,HelperOp_OP_InitForInEnumerator);
  return;
}

Assistant:

void
Lowerer::LowerInitForInEnumerator(IR::Instr * instr)
{
    Js::EnumeratorCache * forInCache = nullptr;
    Func * func = instr->m_func;
    if (instr->IsProfiledInstr())
    {
        uint profileId = instr->AsProfiledInstr()->u.profileId;
        forInCache = instr->m_func->GetJITFunctionBody()->GetForInCache(profileId);
        Assert(forInCache != nullptr);

        if (!func->IsSimpleJit()
#if ENABLE_TTD
            && (func->IsOOPJIT() || !func->GetScriptContext()->GetThreadContext()->IsRuntimeInTTDMode())
            //TODO: We will need to enable OOPJIT info to exclude this if we have a TTD Runtime
#endif
            )
        {
            GenerateInitForInEnumeratorFastPath(instr, forInCache);
        }
    }

    IR::RegOpnd * forInEnumeratorRegOpnd = GenerateForInEnumeratorLoad(instr->UnlinkSrc2(), instr);
    instr->SetSrc2(forInEnumeratorRegOpnd);
    m_lowererMD.LoadHelperArgument(instr, IR::AddrOpnd::New(forInCache, IR::AddrOpndKindForInCache, func));
    this->LowerBinaryHelperMem(instr, IR::HelperOp_OP_InitForInEnumerator);
}